

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddCorr.c
# Opt level: O0

int CorrelCompare(char *key1,char *key2)

{
  HashEntry *entry2;
  HashEntry *entry1;
  char *key2_local;
  char *key1_local;
  
  if ((*(long *)key1 == *(long *)key2) && (*(long *)(key1 + 8) == *(long *)(key2 + 8))) {
    key1_local._4_4_ = 0;
  }
  else {
    key1_local._4_4_ = 1;
  }
  return key1_local._4_4_;
}

Assistant:

static int
CorrelCompare(
  const char * key1,
  const char * key2)
{
    HashEntry *entry1;
    HashEntry *entry2;

    entry1 = (HashEntry *) key1;
    entry2 = (HashEntry *) key2;
    if (entry1->f != entry2->f || entry1->g != entry2->g) return(1);

    return(0);

}